

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::AlterBinder::BindColumnReference
          (BindResult *__return_storage_ptr__,AlterBinder *this,ColumnRefExpression *col_ref,
          idx_t depth)

{
  TableCatalogEntry *this_00;
  vector<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>> *this_01;
  iterator __position;
  pointer pLVar1;
  pointer pLVar2;
  pointer pcVar3;
  bool bVar4;
  BaseExpression *this_02;
  LambdaRefExpression *expr;
  reference pvVar5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  ColumnDefinition *pCVar7;
  LogicalType *other;
  BoundReferenceExpression *this_03;
  BinderException *pBVar8;
  LogicalIndex idx;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_80;
  string local_78;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar4 = ColumnRefExpression::IsQualified(col_ref);
  if (!bVar4) {
    (*(col_ref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_78,col_ref);
    LambdaRefExpression::FindMatchingBinding
              ((LambdaRefExpression *)&local_80,&(this->super_ExpressionBinder).lambda_bindings,
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((BoundReferenceExpression *)local_80._M_head_impl != (BoundReferenceExpression *)0x0) {
      this_02 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&local_80)->super_BaseExpression;
      expr = BaseExpression::Cast<duckdb::LambdaRefExpression>(this_02);
      BindLambdaReference(__return_storage_ptr__,this,expr,depth);
      _Var6._M_head_impl = local_80._M_head_impl;
      goto LAB_011f3c88;
    }
  }
  if (0x20 < (ulong)((long)(col_ref->column_names).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(col_ref->column_names).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    ExpressionBinder::BindQualifiedColumnName
              (__return_storage_ptr__,&this->super_ExpressionBinder,col_ref,
               &(this->table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
    return __return_storage_ptr__;
  }
  this_00 = this->table;
  pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[](&col_ref->column_names,0);
  _Var6._M_head_impl = (ParsedExpression *)TableCatalogEntry::GetColumnIndex(this_00,pvVar5,true);
  local_80._M_head_impl = _Var6._M_head_impl;
  if (_Var6._M_head_impl == (ParsedExpression *)0xffffffffffffffff) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Table does not contain column %s referenced in alter statement!"
               ,"");
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&col_ref->column_names,0);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar3 = (pvVar5->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + pvVar5->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar8,&local_78,&local_50);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar7 = TableCatalogEntry::GetColumn(this->table,(LogicalIndex)_Var6._M_head_impl);
  bVar4 = ColumnDefinition::Generated(pCVar7);
  if (bVar4) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Using generated columns in alter statement not supported","");
    BinderException::BinderException(pBVar8,&local_78);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = (vector<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>> *)this->bound_columns
  ;
  __position._M_current = *(LogicalIndex **)(this_01 + 8);
  if (__position._M_current == *(LogicalIndex **)(this_01 + 0x10)) {
    ::std::vector<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>>::
    _M_realloc_insert<duckdb::LogicalIndex_const&>(this_01,__position,(LogicalIndex *)&local_80);
    _Var6._M_head_impl = local_80._M_head_impl;
  }
  else {
    (__position._M_current)->index = (idx_t)_Var6._M_head_impl;
    *(LogicalIndex **)(this_01 + 8) = __position._M_current + 1;
  }
  pCVar7 = TableCatalogEntry::GetColumn(this->table,(LogicalIndex)_Var6._M_head_impl);
  other = ColumnDefinition::Type(pCVar7);
  pLVar1 = (this->bound_columns->
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->bound_columns->
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_03 = (BoundReferenceExpression *)operator_new(0x60);
  LogicalType::LogicalType((LogicalType *)&local_78,other);
  BoundReferenceExpression::BoundReferenceExpression
            (this_03,(LogicalType *)&local_78,((long)pLVar2 - (long)pLVar1 >> 3) - 1);
  LogicalType::~LogicalType((LogicalType *)&local_78);
  local_58.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this_03;
  BindResult::BindResult(__return_storage_ptr__,&local_58);
  _Var6._M_head_impl = (ParsedExpression *)local_58;
LAB_011f3c88:
  if ((BoundReferenceExpression *)_Var6._M_head_impl != (BoundReferenceExpression *)0x0) {
    (*(((BoundReferenceExpression *)_Var6._M_head_impl)->super_Expression).super_BaseExpression.
      _vptr_BaseExpression[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult AlterBinder::BindColumnReference(ColumnRefExpression &col_ref, idx_t depth) {

	// try binding as a lambda parameter
	if (!col_ref.IsQualified()) {
		auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, col_ref.GetName());
		if (lambda_ref) {
			return BindLambdaReference(lambda_ref->Cast<LambdaRefExpression>(), depth);
		}
	}

	if (col_ref.column_names.size() > 1) {
		return BindQualifiedColumnName(col_ref, table.name);
	}

	auto idx = table.GetColumnIndex(col_ref.column_names[0], true);
	if (!idx.IsValid()) {
		throw BinderException("Table does not contain column %s referenced in alter statement!",
		                      col_ref.column_names[0]);
	}
	if (table.GetColumn(idx).Generated()) {
		throw BinderException("Using generated columns in alter statement not supported");
	}
	bound_columns.push_back(idx);
	return BindResult(make_uniq<BoundReferenceExpression>(table.GetColumn(idx).Type(), bound_columns.size() - 1));
}